

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O0

void __thiscall
asio::execution::detail::any_executor_base::
execute<asio::detail::binder1<std::_Bind<void(nuraft::asio_service_impl::*(nuraft::asio_service_impl*,std::_Placeholder<1>))(std::error_code)>,std::error_code>>
          (any_executor_base *this,
          binder1<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_std::error_code>
          *f)

{
  code *pcVar1;
  binder1<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_std::error_code>
  *in_RSI;
  long in_RDI;
  non_const_lvalue<asio::detail::binder1<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_std::error_code>_>
  f2;
  binder1<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_std::error_code>
  *in_stack_ffffffffffffff70;
  executor_function *this_00;
  allocator<void> *in_stack_ffffffffffffffa0;
  binder1<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_std::error_code>
  *in_stack_ffffffffffffffa8;
  executor_function *in_stack_ffffffffffffffb0;
  executor_function local_30;
  executor_function_view local_28;
  non_const_lvalue<asio::detail::binder1<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_std::error_code>_>
  local_18 [3];
  
  if (*(long *)(*(long *)(in_RDI + 0x28) + 0x18) == 0) {
    pcVar1 = *(code **)(*(long *)(in_RDI + 0x28) + 0x10);
    asio::detail::
    binder1<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_std::error_code>
    ::binder1(in_stack_ffffffffffffff70,
              (binder1<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_std::error_code>
               *)&stack0xffffffffffffffa8);
    this_00 = &local_30;
    asio::detail::executor_function::
    executor_function<asio::detail::binder1<std::_Bind<void(nuraft::asio_service_impl::*(nuraft::asio_service_impl*,std::_Placeholder<1>))(std::error_code)>,std::error_code>,std::allocator<void>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    (*pcVar1)(in_RDI,this_00);
    asio::detail::executor_function::~executor_function(this_00);
  }
  else {
    asio::detail::
    non_const_lvalue<asio::detail::binder1<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_std::error_code>_>
    ::non_const_lvalue(local_18,in_RSI);
    pcVar1 = *(code **)(*(long *)(in_RDI + 0x28) + 0x18);
    asio::detail::executor_function_view::
    executor_function_view<asio::detail::binder1<std::_Bind<void(nuraft::asio_service_impl::*(nuraft::asio_service_impl*,std::_Placeholder<1>))(std::error_code)>,std::error_code>>
              (&local_28,local_18[0].value);
    (*pcVar1)(in_RDI,local_28.complete_,local_28.function_);
  }
  return;
}

Assistant:

void execute(ASIO_MOVE_ARG(F) f) const
  {
    if (target_fns_->blocking_execute != 0)
    {
      asio::detail::non_const_lvalue<F> f2(f);
      target_fns_->blocking_execute(*this, function_view(f2.value));
    }
    else
    {
      target_fns_->execute(*this,
          function(ASIO_MOVE_CAST(F)(f), std::allocator<void>()));
    }
  }